

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O0

void qsoundc_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint local_2c;
  UINT32 curSmpl;
  qsound_chip *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  for (local_2c = 0; local_2c < samples; local_2c = local_2c + 1) {
    update_sample((qsound_chip *)param);
    (*outputs)[local_2c] = (int)*(short *)((long)param + 0x1e);
    outputs[1][local_2c] = (int)*(short *)((long)param + 0x20);
  }
  return;
}

Assistant:

static void qsoundc_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	struct qsound_chip* chip = (struct qsound_chip*)param;
	UINT32 curSmpl;
	
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		update_sample(chip);
		outputs[0][curSmpl] = chip->out[0];
		outputs[1][curSmpl] = chip->out[1];
	}
	
	return;
}